

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong mkvparser::ReadID(IMkvReader *pReader,longlong pos,long *len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  uchar temp_byte;
  byte local_41;
  long *local_40;
  ulong local_38;
  
  if (pos < 0 || pReader == (IMkvReader *)0x0) {
    return -2;
  }
  local_41 = 0;
  iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1);
  if (-1 < iVar1) {
    uVar5 = 0xfffffffffffffffd;
    if (iVar1 != 0) {
      return -3;
    }
    if (local_41 != 0) {
      uVar4 = 0;
      do {
        if ((char)(local_41 << ((byte)uVar4 & 0x1f)) < '\0') {
          uVar3 = (ulong)local_41;
          bVar7 = (int)uVar4 == 0;
          if (bVar7) goto LAB_0010ea47;
          uVar3 = (ulong)local_41 << 8;
          iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos + 1,1,&local_41);
          uVar5 = 0xfffffffffffffffe;
          if (iVar1 < 0) goto LAB_0010ea47;
          lVar6 = pos + 2;
          local_38 = 1;
          uVar2 = uVar4;
          local_40 = len;
          goto LAB_0010e9e3;
        }
        uVar4 = uVar4 + 1;
      } while ((int)uVar4 != 4);
    }
  }
  return -2;
  while( true ) {
    uVar3 = uVar3 | local_41;
    bVar7 = uVar4 <= local_38;
    if (uVar2 == 0) break;
    uVar3 = uVar3 << 8;
    iVar1 = (**pReader->_vptr_IMkvReader)(pReader,lVar6,1,&local_41);
    lVar6 = lVar6 + 1;
    local_38 = local_38 + 1;
    len = local_40;
    if (iVar1 < 0) break;
LAB_0010e9e3:
    uVar2 = uVar2 - 1;
    len = local_40;
    if (iVar1 != 0) {
      uVar5 = 0xfffffffffffffffd;
      break;
    }
  }
LAB_0010ea47:
  if (bVar7) {
    *len = uVar4 + 1;
    uVar5 = uVar3;
  }
  return uVar5;
}

Assistant:

long long ReadID(IMkvReader* pReader, long long pos, long& len) {
  if (pReader == NULL || pos < 0)
    return E_FILE_FORMAT_INVALID;

  // Read the first byte. The length in bytes of the ID is determined by
  // finding the first set bit in the first byte of the ID.
  unsigned char temp_byte = 0;
  int read_status = pReader->Read(pos, 1, &temp_byte);

  if (read_status < 0)
    return E_FILE_FORMAT_INVALID;
  else if (read_status > 0)  // No data to read.
    return E_BUFFER_NOT_FULL;

  if (temp_byte == 0)  // ID length > 8 bytes; invalid file.
    return E_FILE_FORMAT_INVALID;

  int bit_pos = 0;
  const int kMaxIdLengthInBytes = 4;
  const int kCheckByte = 0x80;

  // Find the first bit that's set.
  bool found_bit = false;
  for (; bit_pos < kMaxIdLengthInBytes; ++bit_pos) {
    if ((kCheckByte >> bit_pos) & temp_byte) {
      found_bit = true;
      break;
    }
  }

  if (!found_bit) {
    // The value is too large to be a valid ID.
    return E_FILE_FORMAT_INVALID;
  }

  // Read the remaining bytes of the ID (if any).
  const int id_length = bit_pos + 1;
  long long ebml_id = temp_byte;
  for (int i = 1; i < id_length; ++i) {
    ebml_id <<= 8;
    read_status = pReader->Read(pos + i, 1, &temp_byte);

    if (read_status < 0)
      return E_FILE_FORMAT_INVALID;
    else if (read_status > 0)
      return E_BUFFER_NOT_FULL;

    ebml_id |= temp_byte;
  }

  len = id_length;
  return ebml_id;
}